

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_channel_destroy(ssh2_channel *c)

{
  ssh2_connection_state *ctx;
  ssh2_connection_state *s;
  ssh2_channel *c_local;
  
  ctx = c->connlayer;
  if (c->chanreq_head == (outstanding_channel_request *)0x0) {
    ssh2_channel_close_local(c,(char *)0x0);
    del234(ctx->channels,c);
    ssh2_channel_free(c);
    queue_toplevel_callback(ssh2_check_termination_callback,ctx);
    return;
  }
  __assert_fail("c->chanreq_head == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                ,0x4c9,"void ssh2_channel_destroy(struct ssh2_channel *)");
}

Assistant:

static void ssh2_channel_destroy(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;

    assert(c->chanreq_head == NULL);

    ssh2_channel_close_local(c, NULL);
    del234(s->channels, c);
    ssh2_channel_free(c);

    /*
     * If that was the last channel left open, we might need to
     * terminate. But we'll be a bit cautious, by doing that in a
     * toplevel callback, just in case anything on the current call
     * stack objects to this entire PPL being freed.
     */
    queue_toplevel_callback(ssh2_check_termination_callback, s);
}